

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void hash_destroyMap(void *data)

{
  long *in_RDI;
  linkedlist_t *map;
  
  if (in_RDI != (long *)0x0) {
    hash_destroyMap(in_RDI);
    if (*in_RDI != 0) {
      free((void *)*in_RDI);
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void hash_destroyMap(void *data) {
#ifdef DEBUG
	printf("hash_destroyMap([void *])...\n");
#endif
	if ( data == NULL ) {
#ifdef DEBUG
		printf("hash_destroyMap([void *])... DONE\n");
#endif
		return;
	}
	linkedlist_t *map = (linkedlist_t *) data;
	hash_destroyMap(map->next);
	if ( map->key != NULL ) {
		free(map->key);
	}
	if ( map->value != NULL ) {
		free(map->value);
	}
	free(map);
#ifdef DEBUG
	printf("hash_destroyMap([void *])... DONE\n");
#endif
}